

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O2

string * __thiscall
helics::FederateState::processQuery_abi_cxx11_
          (string *__return_storage_ptr__,FederateState *this,string_view query,bool force_ordering)

{
  __atomic_flag_data_type _Var1;
  bool bVar2;
  string *psVar3;
  undefined7 in_register_00000081;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  char *__s;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  string_view fmt;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  format_args args;
  string sStack_58;
  pointer local_38;
  size_type sStack_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (((int)CONCAT71(in_register_00000081,force_ordering) == 0) &&
     ((((__y_02._M_str = "publications", __y_02._M_len = 0xc, bVar2 = std::operator==(query,__y_02),
        bVar2 || (__y_03._M_str = "inputs", __y_03._M_len = 6, bVar2 = std::operator==(query,__y_03)
                 , bVar2)) ||
       (__y_04._M_str = "endpoints", __y_04._M_len = 9, bVar2 = std::operator==(query,__y_04), bVar2
       )) || (__y_05._M_str = "global_state", __y_05._M_len = 0xc,
             bVar2 = std::operator==(query,__y_05), bVar2)))) {
    processQueryActual_abi_cxx11_(&sStack_58,this,query);
LAB_002b7f48:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (__return_storage_ptr__,&sStack_58);
    std::__cxx11::string::~string((string *)&sStack_58);
  }
  else {
    __y._M_str = "queries";
    __y._M_len = 7;
    bVar2 = std::operator==(query,__y);
    __s = 
    "\"publications\",\"inputs\",\"logs\",\"endpoints\",\"subscriptions\",\"current_state\",\"global_state\",\"dependencies\",\"timeconfig\",\"config\",\"dependents\",\"current_time\",\"global_time\",\"global_status\",\"unconnected_interfaces\""
    ;
    if ((!bVar2) &&
       (__y_00._M_str = "available_queries", __y_00._M_len = 0x11,
       bVar2 = std::operator==(query,__y_00), !bVar2)) {
      __y_01._M_str = "state";
      __y_01._M_len = 5;
      bVar2 = std::operator==(query,__y_01);
      if (bVar2) {
        psVar3 = fedStateString_abi_cxx11_((this->state)._M_i);
        local_38 = (psVar3->_M_dataplus)._M_p;
        sStack_30 = psVar3->_M_string_length;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0x4;
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)&local_38;
        ::fmt::v11::vformat_abi_cxx11_(&sStack_58,(v11 *)0x397bd7,fmt,args);
        goto LAB_002b7f48;
      }
      LOCK();
      _Var1 = (this->processing).super___atomic_flag_base._M_i;
      (this->processing).super___atomic_flag_base._M_i = true;
      UNLOCK();
      if (_Var1 == false) {
        processQueryActual_abi_cxx11_(&sStack_58,this,query);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (__return_storage_ptr__,&sStack_58);
        std::__cxx11::string::~string((string *)&sStack_58);
        LOCK();
        (this->processing).super___atomic_flag_base._M_i = false;
        UNLOCK();
        return __return_storage_ptr__;
      }
      __s = "#wait";
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (__return_storage_ptr__,__s);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FederateState::processQuery(std::string_view query, bool force_ordering) const
{
    std::string qstring;
    if (!force_ordering &&
        (query == "publications" || query == "inputs" || query == "endpoints" ||
         query == "global_state")) {  // these never need to be locked
        qstring = processQueryActual(query);
    } else if ((query == "queries") || (query == "available_queries")) {
        qstring =
            R"("publications","inputs","logs","endpoints","subscriptions","current_state","global_state","dependencies","timeconfig","config","dependents","current_time","global_time","global_status","unconnected_interfaces")";
    } else if (query == "state") {
        qstring = fmt::format("\"{}\"", fedStateString(getState()));
    } else {  // the rest might need be locked to prevent a race condition
        if (try_lock()) {
            qstring = processQueryActual(query);
            unlock();
        } else {
            qstring = "#wait";
        }
    }
    return qstring;
}